

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_registry.c
# Opt level: O2

upb_ExtensionRegistry * upb_ExtensionRegistry_New(upb_Arena *arena)

{
  _Bool _Var1;
  upb_ExtensionRegistry *puVar2;
  upb_ExtensionRegistry *puVar3;
  
  puVar3 = (upb_ExtensionRegistry *)arena->ptr_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)arena->end_dont_copy_me__upb_internal_use_only - (long)puVar3) < 0x18) {
    puVar3 = (upb_ExtensionRegistry *)
             _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(arena,0x18);
  }
  else {
    if ((upb_ExtensionRegistry *)((ulong)((long)&puVar3->arena + 7U) & 0xfffffffffffffff8) != puVar3
       ) {
      __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                    ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
    }
    arena->ptr_dont_copy_me__upb_internal_use_only = (char *)(puVar3 + 1);
  }
  if (puVar3 == (upb_ExtensionRegistry *)0x0) {
    puVar2 = (upb_ExtensionRegistry *)0x0;
  }
  else {
    puVar3->arena = arena;
    _Var1 = upb_strtable_init(&puVar3->exts,8,arena);
    puVar2 = (upb_ExtensionRegistry *)0x0;
    if (_Var1) {
      puVar2 = puVar3;
    }
  }
  return puVar2;
}

Assistant:

upb_ExtensionRegistry* upb_ExtensionRegistry_New(upb_Arena* arena) {
  upb_ExtensionRegistry* r = upb_Arena_Malloc(arena, sizeof(*r));
  if (!r) return NULL;
  r->arena = arena;
  if (!upb_strtable_init(&r->exts, 8, arena)) return NULL;
  return r;
}